

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

void __thiscall
diy::RegularPartners::RegularPartners<diy::RegularDecomposer<diy::Bounds<int>>>
          (RegularPartners *this,RegularDecomposer<diy::Bounds<int>_> *decomposer,int k,
          bool contiguous)

{
  std::vector<int,_std::allocator<int>_>::vector(&this->divisions_,&decomposer->divisions);
  (this->kvs_).
  super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->kvs_).
  super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->kvs_).
  super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->contiguous_ = contiguous;
  (this->steps_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->steps_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->steps_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  factor(k,&this->divisions_,&this->kvs_);
  fill_steps(this);
  return;
}

Assistant:

RegularPartners(const Decomposer_& decomposer, int k, bool contiguous = true):
                  divisions_(decomposer.divisions),
                  contiguous_(contiguous)                       { factor(k, divisions_, kvs_); fill_steps(); }